

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::operator+(Mat *__return_storage_ptr__,Mat *this,ll128 *b)

{
  ulong *puVar1;
  pointer p_Var2;
  pointer p_Var3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar5 = this->c * this->r;
  p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var3 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
    puVar1 = (ulong *)((long)p_Var2 + uVar8);
    uVar9 = (ulong)*b + *puVar1;
    lVar10 = *(long *)((long)b + 8) + *(long *)((long)p_Var2 + uVar8 + 8) +
             (ulong)CARRY8((ulong)*b,*puVar1);
    uVar7 = uVar9 + 0x16345785d8a0003;
    lVar4 = lVar10 + (ulong)(0xfe9cba87a275fffc < uVar9);
    if ((SBORROW8(lVar10,-1) != SBORROW8(lVar10 + 1,(ulong)(uVar9 < 0xfe9cba87a275fffe))) ==
        (long)((lVar10 + 1) - (ulong)(uVar9 < 0xfe9cba87a275fffe)) < 0) {
      uVar7 = uVar9;
      lVar4 = lVar10;
    }
    if (-lVar10 < (long)(ulong)(0x16345785d8a0002 < uVar9)) {
      uVar7 = uVar9 + 0xfe9cba87a275fffd;
      lVar4 = lVar10 + -1 + (ulong)(0x16345785d8a0002 < uVar9);
    }
    *(ulong *)((long)p_Var3 + uVar8) = uVar7;
    *(long *)((long)p_Var3 + uVar8 + 8) = lVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator+(const ll128 &b) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + b;
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}